

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

Moves * __thiscall
Queen::GenerateMoves(Moves *__return_storage_ptr__,Queen *this,Square *source,Position *pos)

{
  Board *board;
  Move m;
  Move local_38;
  
  (__return_storage_ptr__->m_Moves).super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_Moves).super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_Moves).super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((__return_storage_ptr__->m_Moves).super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (__return_storage_ptr__->m_Moves).super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  local_38.m_PromoteTo = &None.super_Piece;
  local_38.m_Source = *source;
  local_38.m_Score = 0;
  board = &pos->m_Board;
  local_38.m_Piece = &this->super_Piece;
  local_38.m_Dest = local_38.m_Source;
  Moves::TryRayAttack(__return_storage_ptr__,&local_38,board,1,1);
  Moves::TryRayAttack(__return_storage_ptr__,&local_38,board,1,-1);
  Moves::TryRayAttack(__return_storage_ptr__,&local_38,board,-1,1);
  Moves::TryRayAttack(__return_storage_ptr__,&local_38,board,-1,-1);
  Moves::TryRayAttack(__return_storage_ptr__,&local_38,board,0,1);
  Moves::TryRayAttack(__return_storage_ptr__,&local_38,board,0,-1);
  Moves::TryRayAttack(__return_storage_ptr__,&local_38,board,-1,0);
  Moves::TryRayAttack(__return_storage_ptr__,&local_38,board,1,0);
  return __return_storage_ptr__;
}

Assistant:

Moves Queen::GenerateMoves( const Square &source, const Position &pos ) const
{
    Moves moves;
    Move m( this, source, source );
    const Board &board = pos.GetBoard();

    moves.TryRayAttack( m, board, 1, 1 );
    moves.TryRayAttack( m, board, 1, -1 );
    moves.TryRayAttack( m, board, -1, 1 );
    moves.TryRayAttack( m, board, -1, -1 );

    moves.TryRayAttack( m, board, 0, 1 );
    moves.TryRayAttack( m, board, 0, -1 );
    moves.TryRayAttack( m, board, -1, 0 );
    moves.TryRayAttack( m, board, 1, 0 );

    return moves;
}